

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

void __thiscall
fmt::BasicWriter<char>::write_str<char>
          (BasicWriter<char> *this,StringValue<char> *s,FormatSpec *spec)

{
  FormatError *this_00;
  size_t precision;
  CStringRef local_38;
  ulong local_30;
  size_t str_size;
  char *str_value;
  FormatSpec *spec_local;
  StringValue<char> *s_local;
  BasicWriter<char> *this_local;
  
  str_value = (char *)spec;
  spec_local = (FormatSpec *)s;
  s_local = (StringValue<char> *)this;
  internal::CharTraits<char>::convert('\0');
  if ((str_value[0x14] != '\0') && (str_value[0x14] != 's')) {
    internal::report_unknown_type(str_value[0x14],"string");
  }
  str_size = *(size_t *)&(spec_local->super_AlignSpec).super_WidthSpec;
  local_30 = *(ulong *)&(spec_local->super_AlignSpec).align_;
  if ((local_30 == 0) && ((WidthSpec)str_size == (WidthSpec)0x0)) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    BasicCStringRef<char>::BasicCStringRef(&local_38,"string pointer is null");
    FormatError::FormatError(this_00,local_38);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  if ((-1 < *(int *)(str_value + 0x10)) && ((ulong)(long)*(int *)(str_value + 0x10) < local_30)) {
    local_30 = (ulong)*(int *)(str_value + 0x10);
  }
  write_str<char>(this,(char *)str_size,local_30,(AlignSpec *)str_value);
  return;
}

Assistant:

void fmt::BasicWriter<Char>::write_str(
    const Arg::StringValue<StrChar> &s, const FormatSpec &spec) {
  // Check if StrChar is convertible to Char.
  internal::CharTraits<Char>::convert(StrChar());
  if (spec.type_ && spec.type_ != 's')
    internal::report_unknown_type(spec.type_, "string");
  const StrChar *str_value = s.value;
  std::size_t str_size = s.size;
  if (str_size == 0) {
    if (!str_value) {
      FMT_THROW(FormatError("string pointer is null"));
      return;
    }
  }
  std::size_t precision = spec.precision_;
  if (spec.precision_ >= 0 && precision < str_size)
    str_size = spec.precision_;
  write_str(str_value, str_size, spec);
}